

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void estimateIndexWidth(Index *pIdx)

{
  LogEst LVar1;
  uint local_28;
  i16 x;
  Column *aCol;
  int i;
  uint wIndex;
  Index *pIdx_local;
  
  aCol._4_4_ = 0;
  for (aCol._0_4_ = 0; (int)aCol < (int)(uint)pIdx->nColumn; aCol._0_4_ = (int)aCol + 1) {
    if (pIdx->aiColumn[(int)aCol] < 0) {
      local_28 = 1;
    }
    else {
      local_28 = (uint)pIdx->pTable->aCol[pIdx->aiColumn[(int)aCol]].szEst;
    }
    aCol._4_4_ = local_28 + aCol._4_4_;
  }
  LVar1 = sqlite3LogEst((ulong)(uint)(aCol._4_4_ << 2));
  pIdx->szIdxRow = LVar1;
  return;
}

Assistant:

static void estimateIndexWidth(Index *pIdx){
  unsigned wIndex = 0;
  int i;
  const Column *aCol = pIdx->pTable->aCol;
  for(i=0; i<pIdx->nColumn; i++){
    i16 x = pIdx->aiColumn[i];
    assert( x<pIdx->pTable->nCol );
    wIndex += x<0 ? 1 : aCol[pIdx->aiColumn[i]].szEst;
  }
  pIdx->szIdxRow = sqlite3LogEst(wIndex*4);
}